

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_chk2(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  uint16_t uVar1;
  int arg2;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 *ppTVar5;
  uint uVar6;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar6 = insn >> 9 & 3;
  switch(uVar6) {
  case 1:
    uVar6 = 1;
    break;
  case 2:
    uVar6 = 2;
    break;
  case 3:
    goto switchD_0067598b_caseD_3;
  }
  uVar1 = read_im16(env,s);
  if ((uVar1 >> 0xb & 1) != 0) {
    pTVar2 = gen_lea(env,s,insn,7);
    pTVar3 = tcg_temp_new_i32(tcg_ctx);
    arg2 = opsize_bytes(uVar6);
    tcg_gen_addi_i32_m68k(tcg_ctx,pTVar3,pTVar2,arg2);
    pTVar4 = gen_load(s,uVar6,pTVar2,1,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    pTVar2 = gen_load(s,uVar6,pTVar3,1,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    pTVar3 = tcg_temp_new_i32(tcg_ctx);
    if ((short)uVar1 < 0) {
      uVar6 = uVar1 >> 0xc & 7;
      if (((uint)s->writeback_mask >> uVar6 & 1) == 0) {
        ppTVar5 = s->uc->tcg_ctx->cpu_aregs;
      }
      else {
        ppTVar5 = s->writeback;
      }
      tcg_gen_mov_i32(tcg_ctx,pTVar3,ppTVar5[uVar6]);
    }
    else {
      gen_ext(tcg_ctx,pTVar3,tcg_ctx->cpu_dregs[uVar1 >> 0xc],uVar6,1);
    }
    gen_flush_flags(s);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_50 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_48 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_m68k(tcg_ctx,helper_chk2_m68k,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    return;
  }
switchD_0067598b_caseD_3:
  gen_exception(s,(s->base).pc_next,4);
  return;
}

Assistant:

DISAS_INSN(chk2)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv addr1, addr2, bound1, bound2, reg;
    int opsize;

    switch ((insn >> 9) & 3) {
    case 0:
        opsize = OS_BYTE;
        break;
    case 1:
        opsize = OS_WORD;
        break;
    case 2:
        opsize = OS_LONG;
        break;
    default:
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }

    ext = read_im16(env, s);
    if ((ext & 0x0800) == 0) {
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }

    addr1 = gen_lea(env, s, insn, OS_UNSIZED);
    addr2 = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_i32(tcg_ctx, addr2, addr1, opsize_bytes(opsize));

    bound1 = gen_load(s, opsize, addr1, 1, IS_USER(s));
    tcg_temp_free(tcg_ctx, addr1);
    bound2 = gen_load(s, opsize, addr2, 1, IS_USER(s));
    tcg_temp_free(tcg_ctx, addr2);

    reg = tcg_temp_new(tcg_ctx);
    if (ext & 0x8000) {
        tcg_gen_mov_i32(tcg_ctx, reg, AREG(ext, 12));
    } else {
        gen_ext(tcg_ctx, reg, DREG(ext, 12), opsize, 1);
    }

    gen_flush_flags(s);
    gen_helper_chk2(tcg_ctx, tcg_ctx->cpu_env, reg, bound1, bound2);
    tcg_temp_free(tcg_ctx, reg);
    tcg_temp_free(tcg_ctx, bound1);
    tcg_temp_free(tcg_ctx, bound2);
}